

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VMinQuotient_Serial(N_Vector num,N_Vector denom)

{
  double dVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double local_48;
  sunrealtype min;
  sunrealtype *dd;
  sunrealtype *nd;
  sunindextype N;
  sunindextype i;
  int notEvenOnce;
  N_Vector denom_local;
  N_Vector num_local;
  
  lVar2 = *(long *)((long)num->content + 0x10);
  lVar3 = *(long *)((long)denom->content + 0x10);
  bVar4 = true;
  min = 1.79769313486232e+308;
  for (i = 0; i < *num->content; i = i + 1) {
    dVar1 = *(double *)(lVar3 + i * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (bVar4) {
        min = *(double *)(lVar2 + i * 8) / *(double *)(lVar3 + i * 8);
        bVar4 = false;
      }
      else {
        if (*(double *)(lVar2 + i * 8) / *(double *)(lVar3 + i * 8) <= min) {
          local_48 = *(double *)(lVar2 + i * 8) / *(double *)(lVar3 + i * 8);
        }
        else {
          local_48 = min;
        }
        min = local_48;
      }
    }
  }
  return min;
}

Assistant:

sunrealtype N_VMinQuotient_Serial(N_Vector num, N_Vector denom)
{
  sunbooleantype notEvenOnce;
  sunindextype i, N;
  sunrealtype *nd, *dd, min;

  nd = dd = NULL;

  N  = NV_LENGTH_S(num);
  nd = NV_DATA_S(num);
  dd = NV_DATA_S(denom);

  notEvenOnce = SUNTRUE;
  min         = SUN_BIG_REAL;

  for (i = 0; i < N; i++)
  {
    if (dd[i] == ZERO) { continue; }
    else
    {
      if (!notEvenOnce) { min = SUNMIN(min, nd[i] / dd[i]); }
      else
      {
        min         = nd[i] / dd[i];
        notEvenOnce = SUNFALSE;
      }
    }
  }

  return (min);
}